

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-wizard.c
# Opt level: O2

_Bool wiz_create_item_subaction(menu *m,ui_event *e,wchar_t oid)

{
  ui_event_type uVar1;
  cmd_code c;
  void *pvVar2;
  command_conflict *pcVar3;
  wchar_t amt;
  char *arg;
  long lVar4;
  
  pvVar2 = menu_priv(m);
  uVar1 = e->type;
  if (uVar1 == EVT_SELECT) {
    lVar4 = (long)oid;
    if (*(int *)((long)pvVar2 + lVar4 * 4) == -9999) {
      if (choose_artifact == false) {
        cmdq_push(CMD_WIZ_CREATE_ALL_OBJ_FROM_TVAL);
        pcVar3 = cmdq_peek();
        cmd_set_arg_number(pcVar3,"tval",*(wchar_t *)((long)pvVar2 + lVar4 * 4 + 4));
        pcVar3 = cmdq_peek();
        cmd_set_arg_choice(pcVar3,"choice",L'\0');
        goto LAB_001e4d39;
      }
      cmdq_push(CMD_WIZ_CREATE_ALL_ARTIFACT_FROM_TVAL);
      pcVar3 = cmdq_peek();
      amt = *(wchar_t *)((long)pvVar2 + lVar4 * 4 + 4);
      arg = "tval";
    }
    else {
      if (choose_artifact == false) {
        c = CMD_WIZ_CREATE_OBJ;
      }
      else {
        c = CMD_WIZ_CREATE_ARTIFACT;
      }
      cmdq_push(c);
      pcVar3 = cmdq_peek();
      amt = *(wchar_t *)((long)pvVar2 + lVar4 * 4);
      arg = "index";
    }
    cmd_set_arg_number(pcVar3,arg,amt);
  }
LAB_001e4d39:
  return uVar1 != EVT_SELECT;
}

Assistant:

static bool wiz_create_item_subaction(struct menu *m, const ui_event *e,
	int oid)
{
	int *choices = menu_priv(m);
	int selected = choices[oid];

	if (e->type != EVT_SELECT) return true;

	if (selected == WIZ_CREATE_ALL_MENU_ITEM && !choose_artifact) {
		cmdq_push(CMD_WIZ_CREATE_ALL_OBJ_FROM_TVAL);
		/* Same hack as in wiz_create_item_subdisplay() to get tval. */
		cmd_set_arg_number(cmdq_peek(), "tval", choices[oid + 1]);
		cmd_set_arg_choice(cmdq_peek(), "choice", 0);
	} else if (selected == WIZ_CREATE_ALL_MENU_ITEM && choose_artifact) {
		cmdq_push(CMD_WIZ_CREATE_ALL_ARTIFACT_FROM_TVAL);
		cmd_set_arg_number(cmdq_peek(), "tval", choices[oid + 1]);
	} else if (selected != WIZ_CREATE_ALL_MENU_ITEM && !choose_artifact) {
		cmdq_push(CMD_WIZ_CREATE_OBJ);
		cmd_set_arg_number(cmdq_peek(), "index", choices[oid]);
	} else if (selected != WIZ_CREATE_ALL_MENU_ITEM && choose_artifact) {
		cmdq_push(CMD_WIZ_CREATE_ARTIFACT);
		cmd_set_arg_number(cmdq_peek(), "index", choices[oid]);
	}

	return false;
}